

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

Matrix<double,_2,_3,_0,_2,_3> *
projects::ipdg_stokes::mesh::computeTangentials
          (Matrix<double,_2,_3,_0,_2,_3> *__return_storage_ptr__,Entity *entity)

{
  ConstRowXpr local_100;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_> local_d0 [48];
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>_>
  local_a0 [56];
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_68;
  DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_48 [8];
  Matrix<double,_2,_3,_0,_2,_3> normals;
  Entity *entity_local;
  Matrix<double,_2,_3,_0,_2,_3> *tang;
  
  normals.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5] =
       (double)entity;
  computeOutwardNormals((Matrix<double,_2,_3,_0,_2,_3> *)local_48,entity);
  Eigen::Matrix<double,_2,_3,_0,_2,_3>::Matrix(__return_storage_ptr__);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::row((ConstRowXpr *)local_d0,local_48,1);
  Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_>::
  operator-((NegativeReturnType *)local_a0,local_d0);
  Eigen::DenseBase<Eigen::Matrix<double,2,3,0,2,3>>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,2,3,0,2,3>> *)__return_storage_ptr__,local_a0
            );
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::row(&local_100,local_48,0);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_68,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1,_3,_false>_> *)
             &local_100);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::~CommaInitializer(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 2, 3> computeTangentials(const lf::mesh::Entity &entity) {
  // Compute the tangentials from the rotated normals
  const auto normals = computeOutwardNormals(entity);
  Eigen::Matrix<double, 2, 3> tang;
  tang << -normals.row(1), normals.row(0);
  return tang;
}